

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

void dump_attr_sublist(FILE *out,attr_list list,int indent)

{
  uint uVar1;
  atom_t atom;
  ushort *puVar2;
  attr_p paVar3;
  int_attr_struct *piVar4;
  char *pcVar5;
  ushort **ppuVar6;
  char *__ptr;
  char *pcVar7;
  double dVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  uchar c [30];
  
  if ((global_as == (atom_server)0x0) &&
     (global_as = init_atom_server(prefill_atom_cache), init_global_atom_server_first == '\0')) {
    init_global_atom_server_first = '\x01';
  }
  if (dump_attr_sublist::IP_ADDR == -1) {
    dump_attr_sublist::CM_ENET_ADDR = attr_atom_from_string("CM_ENET_ADDR");
    dump_attr_sublist::IP_ADDR = attr_atom_from_string("IP_ADDR");
    dump_attr_sublist::NNTI_ADDR = attr_atom_from_string("NNTI_ADDR");
    dump_attr_sublist::PEER_IP = attr_atom_from_string("PEER_IP");
  }
  if (list == (attr_list)0x0) {
    fwrite("[NULL]\n",7,1,(FILE *)out);
    return;
  }
  piVar4 = (list->l).list.iattrs;
  if (piVar4->int_attr_count != '\0') {
    uVar12 = 0;
    do {
      uVar1 = piVar4->iattr[uVar12].attr_id;
      pcVar5 = string_from_atom(global_as,uVar1);
      pcVar11 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        pcVar11 = "<null attr name>";
      }
      c[4] = '\0';
      c._0_4_ = uVar1;
      iVar9 = indent;
      if (0 < indent) {
        do {
          fwrite("    ",4,1,(FILE *)out);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      if ((((uVar1 == dump_attr_sublist::CM_ENET_ADDR) || (uVar1 == dump_attr_sublist::IP_ADDR)) ||
          (uVar1 == dump_attr_sublist::NNTI_ADDR)) || (uVar1 == dump_attr_sublist::PEER_IP)) {
        uVar1 = ((list->l).list.iattrs)->iattr[uVar12].value;
        fprintf((FILE *)out,"    { %s (\'%c%c%c%c\'), Attr_Int4, %d.%d.%d.%d }\n",pcVar11,
                (ulong)c[0],(ulong)c[1],(ulong)c[2],(ulong)c[3],(ulong)(uVar1 >> 0x18),
                (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff));
      }
      else {
        ppuVar6 = __ctype_b_loc();
        puVar2 = *ppuVar6;
        if ((((*(byte *)((long)puVar2 + (ulong)c[0] * 2 + 1) & 0x40) == 0) ||
            ((*(byte *)((long)puVar2 + (ulong)c[1] * 2 + 1) & 0x40) == 0)) ||
           (((*(byte *)((long)puVar2 + (ulong)c[2] * 2 + 1) & 0x40) == 0 ||
            ((*(byte *)((long)puVar2 + (ulong)c[3] * 2 + 1) & 0x40) == 0)))) {
          sprintf((char *)c,"0x%x",(ulong)uVar1);
        }
        fprintf((FILE *)out,"    { %s (\'%s\'), Attr_Int4, %ld }\n",pcVar11,c,
                (long)((list->l).list.iattrs)->iattr[uVar12].value);
      }
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      uVar12 = uVar12 + 1;
      piVar4 = (list->l).list.iattrs;
    } while (uVar12 < piVar4->int_attr_count);
  }
  if (((list->l).list.iattrs)->other_attr_count != '\0') {
    uVar12 = 0;
    do {
      uVar1 = (list->l).list.attributes[uVar12].attr_id;
      pcVar11 = string_from_atom(global_as,uVar1);
      c[4] = '\0';
      c._0_4_ = uVar1;
      ppuVar6 = __ctype_b_loc();
      puVar2 = *ppuVar6;
      if ((((*(byte *)((long)puVar2 + (ulong)c[0] * 2 + 1) & 0x40) == 0) ||
          ((*(byte *)((long)puVar2 + (ulong)c[1] * 2 + 1) & 0x40) == 0)) ||
         (((*(byte *)((long)puVar2 + (ulong)c[2] * 2 + 1) & 0x40) == 0 ||
          ((*(byte *)((long)puVar2 + (ulong)c[3] * 2 + 1) & 0x40) == 0)))) {
        sprintf((char *)c,"0x%x",(ulong)uVar1);
      }
      pcVar5 = pcVar11;
      if (pcVar11 == (char *)0x0) {
        pcVar5 = "<null attr name>";
      }
      iVar9 = indent;
      if (0 < indent) {
        do {
          printf("    ");
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      paVar3 = (list->l).list.attributes;
      switch(paVar3[uVar12].val_type) {
      case Attr_Undefined:
        pcVar7 = "    { %s (\'%s\'), Undefined, Undefined }\n";
        goto LAB_001066dc;
      case Attr_Int4:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x3ca,"void dump_attr_sublist(FILE *, attr_list, int)");
      case Attr_Int8:
        dVar8 = paVar3[uVar12].value.u.d;
        pcVar7 = "    { %s (\'%s\'), Attr_Int8, %ld }\n";
LAB_00106653:
        printf(pcVar7,pcVar5,c,dVar8);
        break;
      case Attr_String:
        dVar8 = (double)paVar3[uVar12].value.u.l;
        if (dVar8 != 0.0) {
          pcVar7 = "    { %s (\'%s\'), Attr_String, %s }\n";
          goto LAB_00106653;
        }
        pcVar7 = "    { %s (\'%s\'), Attr_String, NULL }\n";
        goto LAB_001066dc;
      case Attr_Opaque:
        if (paVar3[uVar12].value.u.l != 0) {
          printf("    { %s (\'%s\'), Attr_Opaque, \"",pcVar5,c);
          if (0 < paVar3[uVar12].value.u.i) {
            lVar10 = 0;
            do {
              putchar((int)*(char *)((long)paVar3[uVar12].value.u.o.buffer + lVar10));
              lVar10 = lVar10 + 1;
            } while (lVar10 < paVar3[uVar12].value.u.i);
          }
          printf("\"\n            <");
          if (0 < paVar3[uVar12].value.u.i) {
            lVar10 = 0;
            do {
              printf(" %02x",(ulong)*(byte *)((long)paVar3[uVar12].value.u.o.buffer + lVar10));
              lVar10 = lVar10 + 1;
            } while (lVar10 < paVar3[uVar12].value.u.i);
          }
          pcVar5 = ">}";
          goto LAB_001066c5;
        }
        pcVar7 = "    { %s (\'%s\'), Attr_Opaque, NULL }\n";
LAB_001066dc:
        printf(pcVar7,pcVar5,c);
        break;
      case Attr_Atom:
        atom = paVar3[uVar12].value.u.i;
        __ptr = string_from_atom(global_as,atom);
        pcVar7 = __ptr;
        if (__ptr == (char *)0x0) {
          pcVar7 = "<null attr name>";
        }
        printf("    { %s (\'%s\'), Attr_Atom, %s (\'%c%c%c%c\') }\n",pcVar5,c,pcVar7,
               (ulong)(uint)(int)(char)atom,(ulong)(uint)(int)(char)((uint)atom >> 8),
               (ulong)(uint)(int)(char)((uint)atom >> 0x10),(ulong)(uint)(atom >> 0x18));
        if (__ptr != (char *)0x0) {
          free(__ptr);
        }
        break;
      case Attr_List:
        printf("    { %s (\'%s\'), Attr_List, ->\n",pcVar5,c);
        internal_dump_attr_list
                  (out,(attr_list)(list->l).list.attributes[uVar12].value.u.p,indent + 1);
        iVar9 = indent;
        if (0 < indent) {
          do {
            printf("    ");
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        pcVar5 = " }";
LAB_001066c5:
        puts(pcVar5);
        break;
      case Attr_Float16:
      case Attr_Float8:
      case Attr_Float4:
        printf("    { %s (\'%s\'), Attr_Float8, %g }\n",paVar3[uVar12].value.u.d,pcVar5,c);
      }
      if (pcVar11 != (char *)0x0) {
        free(pcVar11);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < ((list->l).list.iattrs)->other_attr_count);
  }
  return;
}

Assistant:

static void
dump_attr_sublist(FILE *out, attr_list list, int indent)
{
    int i;
    static atom_t CM_ENET_ADDR = -1;
    static atom_t IP_ADDR = -1;
    static atom_t NNTI_ADDR = -1;
    static atom_t PEER_IP = -1;
    init_global_atom_server(&global_as);
    if (IP_ADDR == -1) {
	CM_ENET_ADDR = attr_atom_from_string("CM_ENET_ADDR");
	IP_ADDR  = attr_atom_from_string("IP_ADDR");
	NNTI_ADDR = attr_atom_from_string("NNTI_ADDR");
	PEER_IP = attr_atom_from_string("PEER_IP");
    }
    if (list == NULL) {
        fprintf(out, "[NULL]\n");
        return;
    }
    for (i = 0; i < list->l.list.iattrs->int_attr_count; i++) {
	int attr_id = list->l.list.iattrs->iattr[i].attr_id;
	unsigned char c[30];
        char *attr_name = string_from_atom(global_as, attr_id), *print_name;
        int j;
	memcpy(&c[0], &attr_id, 4);
	c[4] = 0;
	print_name = attr_name;
        if (attr_name == NULL)
            print_name = "<null attr name>";
        for (j = 0; j < indent; j++) {
            fprintf(out, "    ");
        }
	if ((attr_id == CM_ENET_ADDR) || (attr_id == IP_ADDR) ||
	     (attr_id == NNTI_ADDR) || (attr_id == PEER_IP)) {
	    /* built-in's we want to format differently */
	    unsigned int ip = list->l.list.iattrs->iattr[i].value;
	    fprintf(out, "    { %s ('%c%c%c%c'), Attr_Int4, %d.%d.%d.%d }\n", print_name,
		   c[0], c[1], c[2], c[3],
		   ((ip & 0xff000000) >> 24), ((ip & 0x00ff0000) >> 16), 
		   ((ip & 0x0000ff00) >> 8), (ip & 0x000000ff));
	} else {
	    char *print_id = (char*) &c[0];
	    if ((!isprint((int)c[0])) || (!isprint((int)c[1])) || (!isprint((int)c[2])) || 
		(!isprint((int)c[3]))) {
		sprintf(print_id, "0x%x", attr_id);
	    }
	    fprintf(out, "    { %s ('%s'), Attr_Int4, %ld }\n", print_name,
		   print_id, (long) list->l.list.iattrs->iattr[i].value);
	}
	if (attr_name) free(attr_name);
    }
	
    for (i = 0; i < list->l.list.iattrs->other_attr_count; i++) {
	int attr_id = list->l.list.attributes[i].attr_id;
	unsigned char c[15];
	char *attr_name = string_from_atom(global_as, attr_id);
        char *print_name;
        int j;
	char *print_id = (char*)&c[0];
	print_name = attr_name;
	memcpy(&c[0], &attr_id, 4);
	c[4] = 0;
	if (!isprint((int)c[0]) || !isprint((int)c[1]) || !isprint((int)c[2]) || !isprint((int)c[3])) {
	    sprintf(print_id, "0x%x", attr_id);
	}
        if (attr_name == NULL)
            print_name = "<null attr name>";
        for (j = 0; j < indent; j++) {
            printf("    ");
        }
        switch (list->l.list.attributes[i].val_type) {
        case Attr_Undefined:
            printf("    { %s ('%s'), Undefined, Undefined }\n", 
		   print_name, print_id);
            break;
        case Attr_Int4:
	    assert(0);
            break;
        case Attr_Int8:
            printf("    { %s ('%s'), Attr_Int8, %ld }\n", print_name,
		   print_id,
                   (long) list->l.list.attributes[i].value.u.l);
            break;
        case Attr_Float16:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_Float8:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_Float4:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_String:
            if (((char*)list->l.list.attributes[i].value.u.p) != NULL) {
                printf("    { %s ('%s'), Attr_String, %s }\n", 
		       print_name, print_id,
                       (char *) list->l.list.attributes[i].value.u.p);
            } else {
                printf("    { %s ('%s'), Attr_String, NULL }\n", 
		       print_name, print_id);
            }
            break;          
        case Attr_Opaque:
            if (((char*)list->l.list.attributes[i].value.u.p) != NULL) {
                int j;
                attr_opaque_p o =
                    (attr_opaque_p) &list->l.list.attributes[i].value.u.o;
                printf("    { %s ('%s'), Attr_Opaque, \"", 
		       print_name, print_id);
                for (j=0; j< o->length; j++) {
                    printf("%c", ((char*)o->buffer)[j]);
                }
                printf("\"\n            <");
                for (j=0; j< o->length; j++) {
                    printf(" %02x", ((unsigned char*)o->buffer)[j]);
                }
                printf(">}\n");
            } else {
                printf("    { %s ('%s'), Attr_Opaque, NULL }\n", 
		       print_name, print_id);
            }
            break;
        case Attr_Atom: {
	    int atom_val = (atom_t)(long)list->l.list.attributes[i].value.u.i;
	    char *cv = (char*)&atom_val;
	    char *atom_str, *print_str;
            print_str = atom_str = string_from_atom(global_as, atom_val);
	    if (atom_str == NULL)
		print_str = "<null attr name>";
            printf("    { %s ('%s'), Attr_Atom, %s ('%c%c%c%c') }\n", 
		   print_name, print_id,
                   (char *) print_str, cv[0], cv[1], cv[2], cv[3]);
	    if (atom_str) free(atom_str);
            break;
	}
        case Attr_List:
            printf("    { %s ('%s'), Attr_List, ->\n", print_name,
		   print_id);
            internal_dump_attr_list(out, (attr_list) list->l.list.attributes[i].value.u.p,
                                    indent+1);
            for (j = 0; j< indent; j++) {
                printf("    ");
            }
            printf(" }\n");
            break;
        }
        if (attr_name) free(attr_name);
    }
}